

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btCompoundCollisionAlgorithm::preallocateChildAlgorithms
          (btCompoundCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap)

{
  uint newsize;
  btCollisionShape *pbVar1;
  btDispatcher *pbVar2;
  int iVar3;
  undefined4 extraout_var;
  btCollisionObjectWrapper *pbVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  btCollisionObjectWrapper *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  pbVar4 = body1Wrap;
  if (this->m_isSwapped != false) {
    pbVar4 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pbVar1 = body0Wrap->m_shape;
  newsize = *(uint *)((long)&pbVar1[1]._vptr_btCollisionShape + 4);
  local_58 = (btCollisionObjectWrapper *)0x0;
  btAlignedObjectArray<btCollisionAlgorithm_*>::resize
            (&this->m_childCollisionAlgorithms,newsize,(btCollisionAlgorithm **)&local_58);
  uVar6 = 0;
  uVar7 = (ulong)newsize;
  if ((int)newsize < 1) {
    uVar7 = uVar6;
  }
  lVar5 = 0x40;
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    if (pbVar1[3]._vptr_btCollisionShape == (_func_int **)0x0) {
      local_50 = *(undefined8 *)((long)pbVar1[1].m_userPointer + lVar5);
      local_48 = *(undefined4 *)&body0Wrap->m_collisionObject;
      uStack_44 = *(undefined4 *)((long)&body0Wrap->m_collisionObject + 4);
      uStack_40 = *(undefined4 *)&body0Wrap->m_worldTransform;
      uStack_3c = *(undefined4 *)((long)&body0Wrap->m_worldTransform + 4);
      local_38 = 0xffffffff;
      local_34 = (undefined4)uVar6;
      pbVar2 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
      local_58 = body0Wrap;
      iVar3 = (*pbVar2->_vptr_btDispatcher[2])(pbVar2,&local_58,pbVar4,this->m_sharedManifold);
      (this->m_childCollisionAlgorithms).m_data[uVar6] =
           (btCollisionAlgorithm *)CONCAT44(extraout_var,iVar3);
    }
    else {
      (this->m_childCollisionAlgorithms).m_data[uVar6] = (btCollisionAlgorithm *)0x0;
    }
    lVar5 = lVar5 + 0x58;
  }
  return;
}

Assistant:

void	btCompoundCollisionAlgorithm::preallocateChildAlgorithms(const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap)
{
	const btCollisionObjectWrapper* colObjWrap = m_isSwapped? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* otherObjWrap = m_isSwapped? body0Wrap : body1Wrap;
	btAssert (colObjWrap->getCollisionShape()->isCompound());
	
	const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(colObjWrap->getCollisionShape());

	int numChildren = compoundShape->getNumChildShapes();
	int i;
	
	m_childCollisionAlgorithms.resize(numChildren);
	for (i=0;i<numChildren;i++)
	{
		if (compoundShape->getDynamicAabbTree())
		{
			m_childCollisionAlgorithms[i] = 0;
		} else
		{
			
			const btCollisionShape* childShape = compoundShape->getChildShape(i);

			btCollisionObjectWrapper childWrap(colObjWrap,childShape,colObjWrap->getCollisionObject(),colObjWrap->getWorldTransform(),-1,i);//wrong child trans, but unused (hopefully)
			m_childCollisionAlgorithms[i] = m_dispatcher->findAlgorithm(&childWrap,otherObjWrap,m_sharedManifold);
		}
	}
}